

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent_p.h
# Opt level: O0

QMouseEvent * __thiscall
QEventStorage<QMouseEvent>::store(QEventStorage<QMouseEvent> *this,QMouseEvent *e)

{
  QEventStorage<QMouseEvent> *in_RSI;
  QMouseEvent *in_RDI;
  
  if (((byte)in_RDI[0x50] & 1) != 0) {
    disengage(in_RSI);
  }
  engage(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

Event &store(const Event &e)
    {
        if (m_engaged)
            disengage();
        engage(e);
        return m_event;
    }